

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O0

void __thiscall RK_Individual::resetaPesos(RK_Individual *this,float valor)

{
  int iVar1;
  int local_18;
  int i;
  float valor_local;
  RK_Individual *this_local;
  
  local_18 = 0;
  while( true ) {
    iVar1 = getNumEdges(this);
    if (iVar1 <= local_18) break;
    this->weights[local_18] = (double)valor;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void RK_Individual::resetaPesos(float valor){
    for(int i=0; i< this->getNumEdges(); i++)
        this->weights[i] = valor;
}